

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void plain_array_suite::assign_initializer_list(void)

{
  ulong uVar1;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  ulong uVar2;
  ulong uVar3;
  initializer_list<int> input;
  initializer_list<int> __l;
  initializer_list<int> input_00;
  initializer_list<int> __l_00;
  initializer_list<int> input_01;
  initializer_list<int> __l_01;
  initializer_list<int> input_02;
  initializer_list<int> __l_02;
  initializer_list<int> input_03;
  initializer_list<int> __l_03;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_e9;
  vector<int,_std::allocator<int>_> local_e8;
  circular_view<int,_18446744073709551615UL> local_c8;
  int local_a8 [4];
  circular_view<int,_18446744073709551615UL> *local_98;
  size_type sStack_90;
  circular_view<int,_18446744073709551615UL> *local_88;
  size_type sStack_80;
  circular_view<int,_18446744073709551615UL> *local_78;
  size_type sStack_70;
  circular_view<int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  circular_view<int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  type local_48 [6];
  
  local_c8.member.data = local_48;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_c8.member.cap = 4;
  local_c8.member.size = 0;
  local_c8.member.next = 4;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0xb);
  input._M_len = 1;
  input._M_array = (iterator)&local_e8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_c8,input);
  local_a8[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l,&local_e9);
  uVar1 = local_c8.member.cap * 2;
  uVar2 = uVar1 - (local_c8.member.cap & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_c8.member.next - local_c8.member.size;
  }
  else {
    uVar3 = (local_c8.member.next - local_c8.member.size) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    sStack_50 = uVar1 - 1 & local_c8.member.next;
  }
  else {
    sStack_50 = local_c8.member.next % uVar1;
  }
  first_end.current = sStack_50;
  first_end.parent = &local_c8;
  first_begin.current = uVar3;
  first_begin.parent = &local_c8;
  local_58 = &local_c8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x787,"void plain_array_suite::assign_initializer_list()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x1600000015;
  input_00._M_len = 2;
  input_00._M_array = (iterator)&local_e8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_c8,input_00);
  local_a8[0] = 0x15;
  local_a8[1] = 0x16;
  __l_00._M_len = 2;
  __l_00._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l_00,&local_e9);
  uVar1 = local_c8.member.cap * 2;
  uVar2 = uVar1 - (local_c8.member.cap & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_c8.member.next - local_c8.member.size;
  }
  else {
    uVar3 = (local_c8.member.next - local_c8.member.size) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    sStack_60 = uVar1 - 1 & local_c8.member.next;
  }
  else {
    sStack_60 = local_c8.member.next % uVar1;
  }
  first_end_00.current = sStack_60;
  first_end_00.parent = &local_c8;
  first_begin_00.current = uVar3;
  first_begin_00.parent = &local_c8;
  local_68 = &local_c8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x78d,"void plain_array_suite::assign_initializer_list()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x200000001f;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish._4_4_,0x21);
  input_01._M_len = 3;
  input_01._M_array = (iterator)&local_e8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_c8,input_01);
  local_a8[0] = 0x1f;
  local_a8[1] = 0x20;
  local_a8[2] = 0x21;
  __l_01._M_len = 3;
  __l_01._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l_01,&local_e9);
  uVar1 = local_c8.member.cap * 2;
  uVar2 = uVar1 - (local_c8.member.cap & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_c8.member.next - local_c8.member.size;
  }
  else {
    uVar3 = (local_c8.member.next - local_c8.member.size) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    sStack_70 = uVar1 - 1 & local_c8.member.next;
  }
  else {
    sStack_70 = local_c8.member.next % uVar1;
  }
  first_end_01.current = sStack_70;
  first_end_01.parent = &local_c8;
  first_begin_01.current = uVar3;
  first_begin_01.parent = &local_c8;
  local_78 = &local_c8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x793,"void plain_array_suite::assign_initializer_list()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x2a00000029;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c0000002b;
  input_02._M_len = 4;
  input_02._M_array = (iterator)&local_e8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_c8,input_02);
  local_a8[0] = 0x29;
  local_a8[1] = 0x2a;
  local_a8[2] = 0x2b;
  local_a8[3] = 0x2c;
  __l_02._M_len = 4;
  __l_02._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l_02,&local_e9);
  uVar1 = local_c8.member.cap * 2;
  uVar2 = uVar1 - (local_c8.member.cap & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_c8.member.next - local_c8.member.size;
  }
  else {
    uVar3 = (local_c8.member.next - local_c8.member.size) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    sStack_80 = uVar1 - 1 & local_c8.member.next;
  }
  else {
    sStack_80 = local_c8.member.next % uVar1;
  }
  first_end_02.current = sStack_80;
  first_end_02.parent = &local_c8;
  first_begin_02.current = uVar3;
  first_begin_02.parent = &local_c8;
  local_88 = &local_c8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x799,"void plain_array_suite::assign_initializer_list()",first_begin_02,first_end_02,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x3400000033;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x3600000035;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  input_03._M_len = 5;
  input_03._M_array = (iterator)&local_e8;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_c8,input_03);
  local_a8[0] = 0x34;
  local_a8[1] = 0x35;
  local_a8[2] = 0x36;
  local_a8[3] = 0x37;
  __l_03._M_len = 4;
  __l_03._M_array = local_a8;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l_03,&local_e9);
  uVar1 = local_c8.member.cap * 2;
  uVar2 = uVar1 - (local_c8.member.cap & 0x5555555555555555);
  uVar2 = (uVar2 >> 2 & 0x3333333333333333) + (uVar2 & 0x3333333333333333);
  uVar2 = ((uVar2 >> 4) + uVar2 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar2 >> 0x38 < 2) {
    uVar3 = uVar1 - 1 & local_c8.member.next - local_c8.member.size;
  }
  else {
    uVar3 = (local_c8.member.next - local_c8.member.size) % uVar1;
  }
  if ((byte)(uVar2 >> 0x38) < 2) {
    sStack_90 = uVar1 - 1 & local_c8.member.next;
  }
  else {
    sStack_90 = local_c8.member.next % uVar1;
  }
  first_end_03.current = sStack_90;
  first_end_03.parent = &local_c8;
  first_begin_03.current = uVar3;
  first_begin_03.parent = &local_c8;
  local_98 = &local_c8;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x79f,"void plain_array_suite::assign_initializer_list()",first_begin_03,first_end_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void assign_initializer_list()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.assign({ 11 });
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.assign({ 21, 22 });
    {
        std::vector<int> expect = { 21, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.assign({ 31, 32, 33 });
    {
        std::vector<int> expect = { 31, 32, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.assign({ 41, 42, 43, 44 });
    {
        std::vector<int> expect = { 41, 42, 43, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.assign({ 51, 52, 53, 54, 55 });
    {
        std::vector<int> expect = { 52, 53, 54, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}